

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O0

spv_result_t
spvtools::val::anon_unknown_0::ValidateImageDref
          (ValidationState_t *_,Instruction *inst,ImageTypeInfo *info)

{
  bool bVar1;
  uint32_t uVar2;
  DiagnosticStream *pDVar3;
  spv_const_context psVar4;
  string local_400;
  DiagnosticStream local_3e0;
  DiagnosticStream local_208;
  uint32_t local_2c;
  ImageTypeInfo *pIStack_28;
  uint32_t dref_type;
  ImageTypeInfo *info_local;
  Instruction *inst_local;
  ValidationState_t *__local;
  
  pIStack_28 = info;
  info_local = (ImageTypeInfo *)inst;
  inst_local = (Instruction *)_;
  local_2c = ValidationState_t::GetOperandTypeId(_,inst,4);
  bVar1 = ValidationState_t::IsFloatScalarType((ValidationState_t *)inst_local,local_2c);
  if ((bVar1) &&
     (uVar2 = ValidationState_t::GetBitWidth((ValidationState_t *)inst_local,local_2c),
     uVar2 == 0x20)) {
    psVar4 = ValidationState_t::context((ValidationState_t *)inst_local);
    bVar1 = spvIsVulkanEnv(psVar4->target_env);
    if ((bVar1) && (pIStack_28->dim == Dim3D)) {
      ValidationState_t::diag
                (&local_3e0,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
                 (Instruction *)info_local);
      ValidationState_t::VkErrorID_abi_cxx11_
                (&local_400,(ValidationState_t *)inst_local,0x12a9,(char *)0x0);
      pDVar3 = DiagnosticStream::operator<<(&local_3e0,&local_400);
      pDVar3 = DiagnosticStream::operator<<
                         (pDVar3,(char (*) [72])
                                 "In Vulkan, OpImage*Dref* instructions must not use images with a 3D Dim"
                         );
      __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
      std::__cxx11::string::~string((string *)&local_400);
      DiagnosticStream::~DiagnosticStream(&local_3e0);
    }
    else {
      __local._4_4_ = SPV_SUCCESS;
    }
  }
  else {
    ValidationState_t::diag
              (&local_208,(ValidationState_t *)inst_local,SPV_ERROR_INVALID_DATA,
               (Instruction *)info_local);
    pDVar3 = DiagnosticStream::operator<<
                       (&local_208,(char (*) [41])"Expected Dref to be of 32-bit float type");
    __local._4_4_ = DiagnosticStream::operator_cast_to_spv_result_t(pDVar3);
    DiagnosticStream::~DiagnosticStream(&local_208);
  }
  return __local._4_4_;
}

Assistant:

spv_result_t ValidateImageDref(ValidationState_t& _, const Instruction* inst,
                               const ImageTypeInfo& info) {
  const uint32_t dref_type = _.GetOperandTypeId(inst, 4);
  if (!_.IsFloatScalarType(dref_type) || _.GetBitWidth(dref_type) != 32) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Expected Dref to be of 32-bit float type";
  }

  if (spvIsVulkanEnv(_.context()->target_env)) {
    if (info.dim == spv::Dim::Dim3D) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << _.VkErrorID(4777)
             << "In Vulkan, OpImage*Dref* instructions must not use images "
                "with a 3D Dim";
    }
  }

  return SPV_SUCCESS;
}